

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.c
# Opt level: O2

void ggml_threadpool_resume(ggml_threadpool *threadpool)

{
  pthread_mutex_lock((pthread_mutex_t *)threadpool);
  if ((threadpool->pause & 1U) != 0) {
    ggml_threadpool_resume_locked(threadpool);
  }
  pthread_mutex_unlock((pthread_mutex_t *)threadpool);
  return;
}

Assistant:

void ggml_threadpool_resume(struct ggml_threadpool * threadpool) {
#ifndef GGML_USE_OPENMP
    ggml_mutex_lock(&threadpool->mutex);
    if (threadpool->pause) {
       ggml_threadpool_resume_locked(threadpool);
    }
    ggml_mutex_unlock(&threadpool->mutex);
#else
    UNUSED(threadpool);
#endif
}